

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# watch_list.h
# Opt level: O0

void watch_list_remove(watch_list *wl,uint cref,uint is_bin)

{
  watcher wVar1;
  uint uVar2;
  watcher *pwVar3;
  watcher t;
  uint i;
  watcher *watchers;
  uint is_bin_local;
  uint cref_local;
  watch_list *wl_local;
  
  pwVar3 = watch_list_array(wl);
  if (is_bin == 0) {
    t.cref = wl->n_bin;
    while (pwVar3[t.cref].cref != cref) {
      t.cref = t.cref + 1;
    }
    uVar2 = watch_list_size(wl);
    if (uVar2 <= t.cref) {
      __assert_fail("i < watch_list_size(wl)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/watch_list.h"
                    ,0x75,"void watch_list_remove(struct watch_list *, unsigned int, unsigned int)")
      ;
    }
    wVar1 = wl->watchers[t.cref];
    wl->watchers[t.cref] = wl->watchers[wl->size - 1];
    wl->watchers[wl->size - 1] = wVar1;
  }
  else {
    t.cref = 0;
    while (pwVar3[t.cref].cref != cref) {
      t.cref = t.cref + 1;
    }
    uVar2 = watch_list_size(wl);
    if (uVar2 <= t.cref) {
      __assert_fail("i < watch_list_size(wl)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/watch_list.h"
                    ,0x6f,"void watch_list_remove(struct watch_list *, unsigned int, unsigned int)")
      ;
    }
    wl->n_bin = wl->n_bin - 1;
    memmove(wl->watchers + t.cref,wl->watchers + (ulong)t.cref + 1,
            (ulong)((wl->size - t.cref) - 1) << 3);
  }
  wl->size = wl->size - 1;
  return;
}

Assistant:

static inline void watch_list_remove(struct watch_list *wl, unsigned cref, unsigned is_bin)
{
    struct watcher *watchers = watch_list_array(wl);
    unsigned i;
    if (is_bin) {
        for (i = 0; watchers[i].cref != cref; i++);
        assert(i < watch_list_size(wl));
        wl->n_bin--;
        memmove((wl->watchers + i), (wl->watchers + i + 1),
                (wl->size - i - 1) * sizeof(struct watcher));
    } else {
        for (i = wl->n_bin; watchers[i].cref != cref; i++);
        assert(i < watch_list_size(wl));
        stk_swap(struct watcher, wl->watchers[i], wl->watchers[wl->size - 1]);
    }
    wl->size -= 1;
}